

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

wchar_t cmp_pkill(void *a,void *b)

{
  uint16_t ib;
  uint16_t ia;
  void *b_local;
  void *a_local;
  
  if (l_list[*a].pkills < l_list[*b].pkills) {
    a_local._4_4_ = L'\xffffffff';
  }
  else if (l_list[*b].pkills < l_list[*a].pkills) {
    a_local._4_4_ = L'\x01';
  }
  else {
    a_local._4_4_ = cmp_tkill(a,b);
  }
  return a_local._4_4_;
}

Assistant:

static int cmp_pkill(const void *a, const void *b)
{
	uint16_t ia = *(const uint16_t *)a;
	uint16_t ib = *(const uint16_t *)b;
	if (l_list[ia].pkills < l_list[ib].pkills)
		return -1;
	if (l_list[ia].pkills > l_list[ib].pkills)
		return 1;
	return cmp_tkill(a, b);
}